

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::locate
               (Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *section_addresses)

{
  Section *pSVar1;
  Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *this;
  bool bVar2;
  uint uVar3;
  Section *pSVar4;
  reference ppSVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  value_type local_28;
  Section *section;
  size_t i;
  Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *pPStack_10;
  int current_address;
  Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *section_addresses_local;
  
  i._4_4_ = 0;
  section = (Section *)0x0;
  pPStack_10 = section_addresses;
  while( true ) {
    pSVar1 = section;
    pSVar4 = (Section *)
             std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                       ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table);
    if (pSVar4 <= pSVar1) {
      return;
    }
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::operator[]
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,
                         (size_type)section);
    this = pPStack_10;
    local_28 = *ppSVar5;
    std::__cxx11::string::string((string *)&local_48,(string *)local_28);
    uVar3 = Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::get_property(this,&local_48,i._4_4_);
    local_28->base_address = uVar3;
    std::__cxx11::string::~string((string *)&local_48);
    bVar2 = address_is_free(local_28);
    if (!bVar2) break;
    i._4_4_ = align(local_28->base_address + local_28->content_size,1);
    if (local_28->content_size == 0) {
      std::operator+(&local_f8,"Section \"",&local_28->name);
      std::operator+(&local_d8,&local_f8,"\" is empty");
      warning_report(&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    section = (Section *)&(section->name).field_0x1;
  }
  std::operator+(&local_98,"Section \"",&local_28->name);
  string_printf_abi_cxx11_
            (&local_b8,
             "\" with size %d (0x%x) can\'t be located in address %d (0x%x), this overlap another section.\n"
             ,(ulong)local_28->content_size,(ulong)local_28->content_size,
             (ulong)local_28->base_address);
  std::operator+(&local_78,&local_98,&local_b8);
  error_report(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  exit(1);
}

Assistant:

void Sections::locate(Properties<string, unsigned> *section_addresses)
{
	auto current_address = 0;
	for (size_t i = 0; i < table.size(); ++i) {
		Section *section = table[i];
		section->base_address = section_addresses->get_property(section->name, current_address);
		if ( !address_is_free(section)) {
			error_report("Section \"" + section->name
						 + string_printf("\" with size %d (0x%x) can't be located in address %d (0x%x)"
									 ", this overlap another section.\n",
									 section->content_size, section->content_size,
									 section->base_address, section->base_address));
			exit(EXIT_FAILURE);
		}
		// alinhar o início da secção em endereço par
		current_address = align(section->base_address + section->content_size, 1);
		if (section->content_size == 0)
			warning_report("Section \"" + section->name + "\" is empty");
	}
}